

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void dump_fx(frameex1 *fx_addr68k)

{
  LispPTR *pLVar1;
  LispPTR x;
  DLword *pDVar2;
  char *__format;
  frameex1 *pfVar3;
  DLword *pDVar4;
  
  if ((*(ushort *)&fx_addr68k->field_0x2 & 0xe000) == 0xc000) {
    x = get_framename(fx_addr68k);
    printf("\n*** Frame Extension for ");
    print(x);
    if (((ulong)fx_addr68k & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",fx_addr68k);
    }
    printf("\n %x : %x %x ",(ulong)((long)fx_addr68k - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)fx_addr68k ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->field_0x2 ^ 2));
    putchar(0x5b);
    if ((fx_addr68k->field_0x3 & 0x10) != 0) {
      printf("F,");
    }
    if ((fx_addr68k->field_0x3 & 4) != 0) {
      printf("incall, ");
    }
    if ((fx_addr68k->field_0x3 & 2) != 0) {
      printf("V, ");
    }
    printf("usecnt = %d]; alink",(ulong)(byte)fx_addr68k->field_0x2);
    if ((fx_addr68k->alink & 1) != 0) {
      printf("[SLOWP]");
    }
    pLVar1 = &fx_addr68k->fnheader;
    if (((ulong)pLVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pLVar1);
    }
    printf("\n %x : %x %x fnheadlo, fnheadhi\n",(ulong)((long)pLVar1 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pLVar1 ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->fnheader + 2U) ^ 2));
    pDVar4 = &fx_addr68k->pc;
    if (((ulong)pDVar4 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar4);
    }
    printf("\n %x : %x %x next,     pc\n",(ulong)((long)pDVar4 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pDVar4 ^ 2),
           (ulong)*(ushort *)((ulong)&fx_addr68k->nextblock ^ 2));
    pLVar1 = &fx_addr68k->nametable;
    if (((ulong)pLVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pLVar1);
    }
    printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n",(ulong)((long)pLVar1 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pLVar1 ^ 2),
           (ulong)*(ushort *)((ulong)((long)&fx_addr68k->nametable + 2U) ^ 2));
    pDVar4 = &fx_addr68k->clink;
    if (((ulong)pDVar4 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",pDVar4);
    }
    printf("\n %x : %x %x #blink,   #clink\n",(ulong)((long)pDVar4 - (long)Lisp_world) >> 1,
           (ulong)*(ushort *)((ulong)pDVar4 ^ 2),(ulong)*(ushort *)((ulong)&fx_addr68k->blink ^ 2));
    pDVar2 = MachineState.csp + 2;
    if ((frameex1 *)(MachineState.pvar + -10) != fx_addr68k) {
      pDVar2 = (DLword *)((ulong)((uint)fx_addr68k->nextblock * 2) + (long)Stackspace);
    }
    if (((ulong)pDVar2 & 1) == 0 && pDVar4 <= pDVar2) {
      if (pDVar4 < pDVar2) {
        pfVar3 = fx_addr68k + 1;
        do {
          pDVar4 = pDVar4 + 2;
          if (((ulong)fx_addr68k & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",pDVar4);
          }
          printf("\n %x : %x %x",(ulong)((long)pfVar3 - (long)Lisp_world) >> 1,
                 (ulong)*(ushort *)((ulong)pfVar3 ^ 2),
                 (ulong)*(ushort *)((ulong)&pfVar3->field_0x2 ^ 2));
          pfVar3 = (frameex1 *)&pfVar3->fnheader;
        } while (pDVar4 < pDVar2);
      }
      return;
    }
    __format = "\nNext block invalid";
  }
  else {
    __format = "\nInvalid frame,NOT FX";
  }
  printf(__format);
  return;
}

Assistant:

void dump_fx(struct frameex1 *fx_addr68k) {
  DLword *next68k;
  DLword *ptr;
  LispPTR atomindex;

  ptr = (DLword *)fx_addr68k;

  if (fx_addr68k->flags != 6) {
    printf("\nInvalid frame,NOT FX");
    return;
  }

  atomindex = get_framename((struct frameex1 *)fx_addr68k);
  printf("\n*** Frame Extension for ");
  print(atomindex);
  printf("\n %x : %x %x ", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  putchar('[');
  if (fx_addr68k->fast) printf("F,");
  if (fx_addr68k->incall) printf("incall, ");
  if (fx_addr68k->validnametable) printf("V, ");
  printf("usecnt = %d]; alink", fx_addr68k->usecount);
  if (fx_addr68k->alink & 1) printf("[SLOWP]");

  ptr += 2;
  printf("\n %x : %x %x fnheadlo, fnheadhi\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x next,     pc\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x LoNmTbl,  HiNmTbl\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  ptr += 2;
  printf("\n %x : %x %x #blink,   #clink\n", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));

  /* should pay attention to the name table like RAID does */

  next68k = NativeAligned2FromStackOffset(fx_addr68k->nextblock);
  if (fx_addr68k == CURRENTFX) { next68k = CurrentStackPTR + 2; }

  if ((next68k < ptr) || (((UNSIGNED)next68k & 1) != 0)) {
    printf("\nNext block invalid");
    return;
  }

  while (next68k > ptr) {
    ptr += 2;
    printf("\n %x : %x %x", LAddrFromNative(ptr), GETWORD(ptr), GETWORD(ptr + 1));
  }
}